

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O2

string * to_string_abi_cxx11_(string *__return_storage_ptr__,ze_image_type_t type)

{
  char *pcVar1;
  string local_30;
  
  switch(type) {
  case ZE_IMAGE_TYPE_1D:
    pcVar1 = "ZE_IMAGE_TYPE_1D";
    break;
  case ZE_IMAGE_TYPE_1DARRAY:
    pcVar1 = "ZE_IMAGE_TYPE_1DARRAY";
    break;
  case ZE_IMAGE_TYPE_2D:
    pcVar1 = "ZE_IMAGE_TYPE_2D";
    break;
  case ZE_IMAGE_TYPE_2DARRAY:
    pcVar1 = "ZE_IMAGE_TYPE_2DARRAY";
    break;
  case ZE_IMAGE_TYPE_3D:
    pcVar1 = "ZE_IMAGE_TYPE_3D";
    break;
  default:
    std::__cxx11::to_string(&local_30,type);
    std::operator+(__return_storage_ptr__,"Unknown ze_image_type_t value: ",&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const ze_image_type_t type) {
  if (type == ZE_IMAGE_TYPE_1D) {
    return "ZE_IMAGE_TYPE_1D";
  } else if (type == ZE_IMAGE_TYPE_2D) {
    return "ZE_IMAGE_TYPE_2D";
  } else if (type == ZE_IMAGE_TYPE_3D) {
    return "ZE_IMAGE_TYPE_3D";
  } else if (type == ZE_IMAGE_TYPE_1DARRAY) {
    return "ZE_IMAGE_TYPE_1DARRAY";
  } else if (type == ZE_IMAGE_TYPE_2DARRAY) {
    return "ZE_IMAGE_TYPE_2DARRAY";
  } else {
    return "Unknown ze_image_type_t value: " +
           std::to_string(static_cast<int>(type));
  }
}